

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugLine.cpp
# Opt level: O3

bool __thiscall
llvm::DWARFDebugLine::LineTable::lookupAddressRangeImpl
          (LineTable *this,SectionedAddress Address,uint64_t Size,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *Result)

{
  uint uVar1;
  pointer pSVar2;
  iterator __position;
  uint uVar3;
  uint32_t uVar4;
  difference_type __d;
  ulong uVar5;
  ulong extraout_RAX;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  pointer Seq;
  Sequence *Seq_00;
  SectionedAddress Address_00;
  undefined1 local_90 [8];
  Sequence Sequence;
  uint local_38;
  undefined4 local_34;
  ulong uVar6;
  
  uVar7 = Address.SectionIndex;
  uVar8 = Address.Address;
  if ((this->Sequences).
      super__Vector_base<llvm::DWARFDebugLine::Sequence,_std::allocator<llvm::DWARFDebugLine::Sequence>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (this->Sequences).
      super__Vector_base<llvm::DWARFDebugLine::Sequence,_std::allocator<llvm::DWARFDebugLine::Sequence>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    return false;
  }
  DWARFDebugLine::Sequence::Sequence((Sequence *)local_90);
  Seq = (this->Sequences).
        super__Vector_base<llvm::DWARFDebugLine::Sequence,_std::allocator<llvm::DWARFDebugLine::Sequence>_>
        ._M_impl.super__Vector_impl_data._M_start;
  pSVar2 = (this->Sequences).
           super__Vector_base<llvm::DWARFDebugLine::Sequence,_std::allocator<llvm::DWARFDebugLine::Sequence>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (0 < (long)pSVar2 - (long)Seq) {
    uVar6 = ((ulong)((long)pSVar2 - (long)Seq) >> 3) * -0x3333333333333333;
    do {
      uVar5 = uVar6 >> 1;
      if ((Seq[uVar5].SectionIndex <= uVar7) &&
         ((Seq[uVar5].SectionIndex < uVar7 || (Seq[uVar5].HighPC <= uVar8)))) {
        Seq = Seq + uVar5 + 1;
        uVar5 = ~uVar5 + uVar6;
      }
      uVar6 = uVar5;
    } while (0 < (long)uVar5);
  }
  if (Seq != pSVar2) {
    local_34 = 0;
    if ((Seq->SectionIndex != uVar7) || (uVar8 < Seq->LowPC)) goto LAB_00d6638e;
    if (uVar8 < Seq->HighPC) {
      uVar6 = (Size + uVar8) - 1;
      Seq_00 = Seq;
      Sequence.LowPC = uVar8;
      Sequence.HighPC = uVar7;
      Sequence._32_8_ = uVar6;
      do {
        local_34 = (undefined4)CONCAT71((int7)(uVar6 >> 8),1);
        if (Size + uVar8 <= Seq_00->LowPC) break;
        if (Seq_00 == Seq) {
          uVar9 = findRowInSeq(this,Seq,Address);
        }
        else {
          uVar9 = Seq_00->FirstRowIndex;
        }
        Address_00.SectionIndex = uVar7;
        Address_00.Address = Sequence._32_8_;
        uVar4 = findRowInSeq(this,Seq_00,Address_00);
        uVar6 = (ulong)uVar4;
        uVar1 = this->UnknownRowIndex;
        uVar3 = Seq_00->LastRowIndex - 1;
        if (uVar4 != uVar1) {
          uVar3 = uVar4;
        }
        if (uVar9 == uVar1) {
          __assert_fail("FirstRowIndex != UnknownRowIndex",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/DWARFDebugLine.cpp"
                        ,0x3f4,
                        "bool llvm::DWARFDebugLine::LineTable::lookupAddressRangeImpl(object::SectionedAddress, uint64_t, std::vector<uint32_t> &) const"
                       );
        }
        if (uVar3 == uVar1) {
          __assert_fail("LastRowIndex != UnknownRowIndex",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/DWARFDebugLine.cpp"
                        ,0x3f5,
                        "bool llvm::DWARFDebugLine::LineTable::lookupAddressRangeImpl(object::SectionedAddress, uint64_t, std::vector<uint32_t> &) const"
                       );
        }
        while (local_38 = uVar9, uVar9 <= uVar3) {
          __position._M_current =
               (Result->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (Result->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_int,std::allocator<unsigned_int>>::
            _M_realloc_insert<unsigned_int_const&>
                      ((vector<unsigned_int,std::allocator<unsigned_int>> *)Result,__position,
                       &local_38);
            uVar6 = extraout_RAX;
          }
          else {
            *__position._M_current = uVar9;
            (Result->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_finish = __position._M_current + 1;
          }
          uVar9 = local_38 + 1;
        }
        Seq_00 = Seq_00 + 1;
      } while (Seq_00 != pSVar2);
      goto LAB_00d6638e;
    }
  }
  local_34 = 0;
LAB_00d6638e:
  return (bool)(undefined1)local_34;
}

Assistant:

bool DWARFDebugLine::LineTable::lookupAddressRangeImpl(
    object::SectionedAddress Address, uint64_t Size,
    std::vector<uint32_t> &Result) const {
  if (Sequences.empty())
    return false;
  uint64_t EndAddr = Address.Address + Size;
  // First, find an instruction sequence containing the given address.
  DWARFDebugLine::Sequence Sequence;
  Sequence.SectionIndex = Address.SectionIndex;
  Sequence.HighPC = Address.Address;
  SequenceIter LastSeq = Sequences.end();
  SequenceIter SeqPos = llvm::upper_bound(
      Sequences, Sequence, DWARFDebugLine::Sequence::orderByHighPC);
  if (SeqPos == LastSeq || !SeqPos->containsPC(Address))
    return false;

  SequenceIter StartPos = SeqPos;

  // Add the rows from the first sequence to the vector, starting with the
  // index we just calculated

  while (SeqPos != LastSeq && SeqPos->LowPC < EndAddr) {
    const DWARFDebugLine::Sequence &CurSeq = *SeqPos;
    // For the first sequence, we need to find which row in the sequence is the
    // first in our range.
    uint32_t FirstRowIndex = CurSeq.FirstRowIndex;
    if (SeqPos == StartPos)
      FirstRowIndex = findRowInSeq(CurSeq, Address);

    // Figure out the last row in the range.
    uint32_t LastRowIndex =
        findRowInSeq(CurSeq, {EndAddr - 1, Address.SectionIndex});
    if (LastRowIndex == UnknownRowIndex)
      LastRowIndex = CurSeq.LastRowIndex - 1;

    assert(FirstRowIndex != UnknownRowIndex);
    assert(LastRowIndex != UnknownRowIndex);

    for (uint32_t I = FirstRowIndex; I <= LastRowIndex; ++I) {
      Result.push_back(I);
    }

    ++SeqPos;
  }

  return true;
}